

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndicapi.cxx
# Opt level: O0

void anon_unknown.dwarf_ac3::ndiCOMMHelper(ndicapi *pol,char *command,char *commandReply)

{
  int iVar1;
  uint local_2c;
  int local_28;
  int newhand;
  int newspeed;
  char newdps [4];
  char *commandReply_local;
  char *command_local;
  ndicapi *pol_local;
  
  newhand = 0x314e38;
  local_28 = 0x2580;
  if ((('/' < command[5]) && (command[5] < '8')) || (command[5] == 'A')) {
    if (command[5] == 'A') {
      local_28 = 0x38400;
    }
    else {
      local_28 = ndiCOMMHelper::convert_baud[command[5] + -0x30];
    }
  }
  if (command[6] == '1') {
    newhand = 0x314e37;
  }
  if (command[7] == '1') {
    newhand._0_2_ = CONCAT11(0x4f,(undefined1)newhand);
  }
  else if (command[7] == '2') {
    newhand._0_2_ = CONCAT11(0x45,(undefined1)newhand);
  }
  if (command[8] == '1') {
    newhand = (int)CONCAT12(0x32,(undefined2)newhand);
  }
  local_2c = (uint)(command[9] == '1');
  _newspeed = commandReply;
  ndiSerialSleep(pol->SerialDevice,100);
  iVar1 = ndiSerialComm(pol->SerialDevice,local_28,(char *)&newhand,local_2c);
  if (iVar1 != 0) {
    ndiSetError(pol,0x102);
  }
  return;
}

Assistant:

void ndiCOMMHelper(ndicapi* pol, const char* command, const char* commandReply)
  {
    static int convert_baud[8] = { 9600, 14400, 19200, 38400, 57600, 115200, 921600, 1228739 };
    char newdps[4] = "8N1";
    int newspeed = 9600;
    int newhand = 0;

    if (command[5] >= '0' && command[5] <= '7' || command[5] == 'A')
    {
      if (command[5] != 'A')
      {
        newspeed = convert_baud[command[5] - '0'];
      }
      else
      {
        newspeed = 230400;
      }
    }
    if (command[6] == '1')
    {
      newdps[0] = '7';
    }
    if (command[7] == '1')
    {
      newdps[1] = 'O';
    }
    else if (command[7] == '2')
    {
      newdps[1] = 'E';
    }
    if (command[8] == '1')
    {
      newdps[2] = '2';
    }
    if (command[9] == '1')
    {
      newhand = 1;
    }

    ndiSerialSleep(pol->SerialDevice, 100);  // let the device adjust itself
    if (ndiSerialComm(pol->SerialDevice, newspeed, newdps, newhand) != 0)
    {
      ndiSetError(pol, NDI_BAD_COMM);
    }
  }